

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_PlaneEquation *
ON_PlaneEquation::CreateFromThreePoints(ON_3dPoint pointA,ON_3dPoint pointB,ON_3dPoint pointC)

{
  ON_3dPoint point;
  ON_3dVector normal;
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ON_PlaneEquation *in_RDI;
  ON_3dVector Y;
  ON_3dVector X;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  double local_30;
  
  bVar4 = ON_3dPoint::IsValid((ON_3dPoint *)&stack0x00000008);
  if (bVar4) {
    bVar4 = ON_3dPoint::IsValid((ON_3dPoint *)&stack0x00000020);
    if (bVar4) {
      bVar4 = ON_3dPoint::IsValid((ON_3dPoint *)&stack0x00000038);
      if (bVar4) {
        ON_3dPoint::operator-
                  ((ON_3dVector *)&stack0xffffffffffffffc0,(ON_3dPoint *)&stack0x00000020,
                   (ON_3dPoint *)&stack0x00000008);
        ON_3dPoint::operator-
                  ((ON_3dVector *)&stack0xffffffffffffffa8,(ON_3dPoint *)&stack0x00000038,
                   (ON_3dPoint *)&stack0x00000008);
        ON_3dVector::ON_3dVector
                  ((ON_3dVector *)&stack0xffffffffffffff90,
                   in_stack_ffffffffffffffc8 * in_stack_ffffffffffffffb8 -
                   local_30 * in_stack_ffffffffffffffb0,
                   local_30 * in_stack_ffffffffffffffa8 -
                   in_stack_ffffffffffffffb8 * in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffc0 * in_stack_ffffffffffffffb0 -
                   in_stack_ffffffffffffffc8 * in_stack_ffffffffffffffa8);
        point.y = in_stack_ffffffffffffffa8;
        point.x = in_stack_ffffffffffffffa0;
        point.z = in_stack_ffffffffffffffb0;
        normal.y = in_stack_ffffffffffffffc0;
        normal.x = in_stack_ffffffffffffffb8;
        normal.z = in_stack_ffffffffffffffc8;
        CreateFromPointAndNormal(point,normal);
        return in_RDI;
      }
    }
  }
  dVar3 = NanPlaneEquation.d;
  dVar2 = NanPlaneEquation.y;
  dVar1 = NanPlaneEquation.x;
  in_RDI->z = NanPlaneEquation.z;
  in_RDI->d = dVar3;
  in_RDI->x = dVar1;
  in_RDI->y = dVar2;
  return in_RDI;
}

Assistant:

const ON_PlaneEquation ON_PlaneEquation::CreateFromThreePoints(
  ON_3dPoint pointA,
  ON_3dPoint pointB,
  ON_3dPoint pointC
)
{
  if (pointA.IsValid() && pointB.IsValid() && pointC.IsValid())
  {
    const ON_3dVector X = pointB - pointA;
    const ON_3dVector Y = pointC - pointA;
    return ON_PlaneEquation::CreateFromPointAndNormal(pointA, ON_3dVector::CrossProduct(X, Y));
  }
  return ON_PlaneEquation::NanPlaneEquation;
}